

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqllogictest.cpp
# Opt level: O0

void listFiles(FileSystem *fs,string *path,
              function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *cb)

{
  undefined8 in_RSI;
  long *in_RDI;
  anon_class_24_3_190d94ce *__f;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *in_stack_ffffffffffffffa0;
  anon_class_24_3_190d94ce local_38 [2];
  
  __f = local_38;
  std::function<void(std::__cxx11::string_const&,bool)>::
  function<listFiles(duckdb::FileSystem&,std::__cxx11::string_const&,std::function<void(std::__cxx11::string_const&)>)::__0,void>
            (in_stack_ffffffffffffffa0,__f);
  (**(code **)(*in_RDI + 0x88))(in_RDI,in_RSI,__f,0);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
               *)0x7d91e6);
  return;
}

Assistant:

static void listFiles(FileSystem &fs, const string &path, std::function<void(const string &)> cb) {
	fs.ListFiles(path, [&](string fname, bool is_dir) {
		string full_path = fs.JoinPath(path, fname);
		if (is_dir) {
			// recurse into directory
			listFiles(fs, full_path, cb);
		} else {
			cb(full_path);
		}
	});
}